

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_stream.cpp
# Opt level: O1

bool __thiscall
libtorrent::aux::utp_socket_impl::resend_packet(utp_socket_impl *this,packet *p,bool fast_resend)

{
  _Atomic_word *p_Var1;
  byte bVar2;
  ushort uVar3;
  undefined2 uVar4;
  uint uVar5;
  uint32_t uVar6;
  utp_socket_manager *this_00;
  uint val;
  long lVar7;
  int iVar8;
  ushort uVar9;
  undefined1 *puVar10;
  bool bVar11;
  error_code ec;
  error_code local_70;
  weak_ptr<libtorrent::aux::utp_socket_interface> local_60;
  basic_endpoint<boost::asio::ip::udp> local_4c;
  
  if (((this->m_error).failed_ == false) && ((this->field_0x21d & 0x40) == 0)) {
    uVar4 = this->m_acked_seq_nr;
    if (this->m_mtu_seq != 0 && (uint16_t)(uVar4 + 1) == this->m_mtu_seq) {
      this->m_mtu_seq = 0;
      p->field_0xe = p->field_0xe & 0x7f;
      this->m_mtu_ceiling = p->size - 1;
      update_mtu_limits(this);
    }
    iVar8 = this->m_bytes_in_flight;
    if (!fast_resend) {
      uVar6 = *(uint32_t *)((long)&this->m_cwnd + 2);
      if ((int)this->m_adv_wnd < (int)uVar6) {
        uVar6 = this->m_adv_wnd;
      }
      if ((0 < iVar8) && ((int)(uVar6 - iVar8) < (int)((uint)p->size - (uint)p->header_size))) {
        this->field_0x21d = this->field_0x21d | 4;
        goto LAB_0039c4a7;
      }
    }
    if ((p->field_0xe & 0x40) != 0) {
      this->m_bytes_in_flight = (iVar8 + (uint)p->size) - (uint)p->header_size;
    }
    utp_socket_manager::inc_stats_counter(this->m_sm,0xa8,1);
    if (fast_resend) {
      utp_socket_manager::inc_stats_counter(this->m_sm,0xa7,1);
    }
    p->field_0xe = p->field_0xe & 0xbf;
    uVar5 = this->m_reply_micro;
    puVar10 = (undefined1 *)((long)&p[1].send_time.__d.__r + 7);
    iVar8 = 0x18;
    do {
      *puVar10 = (char)(uVar5 >> ((byte)iVar8 & 0x1f));
      puVar10 = puVar10 + 1;
      iVar8 = iVar8 + -8;
    } while (iVar8 != -8);
    lVar7 = ::std::chrono::_V2::system_clock::now();
    (p->send_time).__d.__r = lVar7;
    puVar10 = (undefined1 *)((long)&p[1].send_time.__d.__r + 3);
    iVar8 = 0x18;
    do {
      *puVar10 = (char)((uint)((int)(SUB168(SEXT816(lVar7) * SEXT816(0x20c49ba5e353f7cf),8) >> 7) -
                              (SUB164(SEXT816(lVar7) * SEXT816(0x20c49ba5e353f7cf),0xc) >> 0x1f)) >>
                       ((byte)iVar8 & 0x1f));
      puVar10 = puVar10 + 1;
      iVar8 = iVar8 + -8;
    } while (iVar8 != -8);
    if ((char)p[1].send_time.__d.__r == '\x01') {
      lVar7 = 0;
      uVar9 = 0;
      do {
        uVar9 = (ushort)p[2].buf[lVar7 + -0xe] | uVar9 << 8;
        lVar7 = lVar7 + 1;
      } while ((int)lVar7 == 1);
      if (uVar9 != this->m_ack_nr) {
        bVar2 = *(byte *)((long)&p[2].send_time.__d.__r + 4);
        if ((this->m_inbuf).m_size == 0) {
          *(undefined1 *)&p[1].send_time.__d.__r =
               *(undefined1 *)((long)&p[2].send_time.__d.__r + 3);
          uVar9 = p->size;
          uVar3 = p->header_size;
          memmove((void *)((long)&p[2].send_time.__d.__r + 3),p[2].buf + ((ulong)bVar2 - 10),
                  (ulong)uVar9 - (ulong)uVar3);
          p->header_size = uVar3 - (bVar2 + 2);
          p->size = uVar9 - (bVar2 + 2);
        }
        else {
          write_sack(this,(uint8_t *)((long)&p[2].send_time.__d.__r + 5),(uint)bVar2);
        }
      }
    }
    uVar9 = this->m_ack_nr;
    puVar10 = (undefined1 *)((long)&p[2].send_time.__d.__r + 1);
    iVar8 = 8;
    do {
      *puVar10 = (char)(uVar9 >> ((byte)iVar8 & 0x1f));
      puVar10 = puVar10 + 1;
      iVar8 = iVar8 + -8;
    } while (iVar8 != -8);
    local_70.val_ = 0;
    local_70._4_4_ = local_70._4_4_ & 0xffffff00;
    local_70.cat_ =
         &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
    local_60.super___weak_ptr<libtorrent::aux::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (this->m_sock).
             super___weak_ptr<libtorrent::aux::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    this_00 = this->m_sm;
    local_60.super___weak_ptr<libtorrent::aux::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (this->m_sock).
         super___weak_ptr<libtorrent::aux::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_60.super___weak_ptr<libtorrent::aux::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_60.
         super___weak_ptr<libtorrent::aux::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_weak_count =
             (local_60.
              super___weak_ptr<libtorrent::aux::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_weak_count + 1;
        UNLOCK();
      }
      else {
        (local_60.
         super___weak_ptr<libtorrent::aux::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_weak_count =
             (local_60.
              super___weak_ptr<libtorrent::aux::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_weak_count + 1;
      }
    }
    boost::asio::ip::basic_endpoint<boost::asio::ip::udp>::basic_endpoint
              (&local_4c,&this->m_remote_address,this->m_port);
    utp_socket_manager::send_packet
              (this_00,&local_60,&local_4c,(char *)p->buf,(uint)p->size,&local_70,
               (udp_send_flags_t)0x0);
    if (local_60.super___weak_ptr<libtorrent::aux::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &(local_60.
                   super___weak_ptr<libtorrent::aux::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi)->_M_weak_count;
        iVar8 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        iVar8 = (local_60.
                 super___weak_ptr<libtorrent::aux::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi)->_M_weak_count;
        (local_60.
         super___weak_ptr<libtorrent::aux::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_weak_count = iVar8 + -1;
      }
      if (iVar8 == 1) {
        (*(local_60.
           super___weak_ptr<libtorrent::aux::utp_socket_interface,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_vptr__Sp_counted_base[3])();
      }
    }
    if ((local_70.val_ == 0xb) &&
       (((local_70.cat_)->id_ == 0x8fafd21e25c5e09b || ((local_70.cat_)->id_ == 0x8fafd21e25c5e09b))
       )) {
      this->field_0x21d = this->field_0x21d | 0x40;
      utp_socket_manager::subscribe_writable(this->m_sm,this);
      p->field_0xe = p->field_0xe | 0x40;
      this->m_bytes_in_flight = this->m_bytes_in_flight + ((uint)p->header_size - (uint)p->size);
    }
    else {
      if (local_70.failed_ == true) {
        (this->m_error).val_ = local_70.val_;
        (this->m_error).failed_ = (bool)local_70.failed_;
        *(int3 *)&(this->m_error).field_0x5 = local_70._5_3_;
        (this->m_error).cat_ = local_70.cat_;
        set_state(this,error_wait);
        test_socket_state(this);
        goto LAB_0039c4a7;
      }
      utp_socket_manager::inc_stats_counter(this->m_sm,0xa6,1);
      this->m_out_packets = this->m_out_packets + 1;
      p->field_0xe = p->field_0xe & 0xc0 | p->field_0xe + 1 & 0x3f;
    }
    bVar11 = (this->field_0x21d & 0x40) == 0;
  }
  else {
LAB_0039c4a7:
    bVar11 = false;
  }
  return bVar11;
}

Assistant:

bool utp_socket_impl::resend_packet(packet* p, bool fast_resend)
{
	INVARIANT_CHECK;

	// for fast re-sends the packet hasn't been marked as needing resending
	TORRENT_ASSERT(p->need_resend || fast_resend);

	if (m_error) return false;
	if (m_stalled) return false;

	if (((m_acked_seq_nr + 1) & ACK_MASK) == m_mtu_seq
		&& m_mtu_seq != 0)
	{
		m_mtu_seq = 0;
		p->mtu_probe = false;
		// we got multiple acks for the packet before our probe, assume
		// it was dropped because it was too big
		m_mtu_ceiling = p->size - 1;
		update_mtu_limits();
	}

	// we can only resend the packet if there's
	// enough space in our congestion window
	// since we can't re-packetize, some packets that are
	// larger than the congestion window must be allowed through
	// but only if we don't have any outstanding bytes
	int const window_size_left = std::min(int(m_cwnd >> 16), int(m_adv_wnd)) - m_bytes_in_flight;
	if (!fast_resend
		&& p->size - p->header_size > window_size_left
		&& m_bytes_in_flight > 0)
	{
		m_cwnd_full = true;
		return false;
	}

	// plus one since we have fast-resend as well, which doesn't
	// necessarily trigger by a timeout
	// the fast-resend path does not check for too many resends, that's only in
	// the time-out path
	TORRENT_ASSERT_VAL(fast_resend || p->num_transmissions < m_sm.num_resends() + 1, m_sm.num_resends());

	TORRENT_ASSERT(p->size - p->header_size >= 0);
	if (p->need_resend) m_bytes_in_flight += p->size - p->header_size;

	m_sm.inc_stats_counter(counters::utp_packet_resend);
	if (fast_resend) m_sm.inc_stats_counter(counters::utp_fast_retransmit);

#if TORRENT_USE_ASSERTS
	if (fast_resend) ++p->num_fast_resend;
#endif
	p->need_resend = false;
	auto* h = reinterpret_cast<utp_header*>(p->buf);
	// update packet header
	h->timestamp_difference_microseconds = m_reply_micro;
	p->send_time = clock_type::now();
	h->timestamp_microseconds = std::uint32_t(
		total_microseconds(p->send_time.time_since_epoch()) & 0xffffffff);

	// if the packet has a selective ack header, we'll need
	// to update it
	if (h->extension == utp_sack && h->ack_nr != m_ack_nr)
	{
		std::uint8_t* ptr = p->buf + sizeof(utp_header);
		int sack_size = ptr[1];
		if (m_inbuf.size())
		{
			// update the sack header
			write_sack(ptr + 2, sack_size);
			TORRENT_ASSERT(ptr + sack_size + 2 <= p->buf + p->header_size);
		}
		else
		{
			remove_sack_header(p);
		}
	}

	h->ack_nr = m_ack_nr;

	error_code ec;
	m_sm.send_packet(m_sock, udp::endpoint(m_remote_address, m_port)
		, reinterpret_cast<char const*>(p->buf), p->size, ec);

#if TORRENT_UTP_LOG
	UTP_LOGV("%8p: re-sending packet seq_nr:%d ack_nr:%d type:%s "
		"id:%d target:%s size:%d error:%s send_buffer_size:%d cwnd:%d "
		"adv_wnd:%d in-flight:%d mtu:%d timestamp:%u time_diff:%d\n"
		, static_cast<void*>(this), int(h->seq_nr), int(h->ack_nr), packet_type_names[h->get_type()]
		, m_send_id, print_endpoint(udp::endpoint(m_remote_address, m_port)).c_str()
		, p->size, ec.message().c_str(), m_write_buffer_size, int(m_cwnd >> 16)
		, m_adv_wnd, m_bytes_in_flight, m_mtu, std::uint32_t(h->timestamp_microseconds)
		, std::uint32_t(h->timestamp_difference_microseconds));
#endif

	if (ec == error::would_block || ec == error::try_again)
	{
#if TORRENT_UTP_LOG
		UTP_LOGV("%8p: socket stalled\n", static_cast<void*>(this));
#endif
		TORRENT_ASSERT(!m_stalled);
		m_stalled = true;
		m_sm.subscribe_writable(this);
		p->need_resend = true;
		m_bytes_in_flight -= p->size - p->header_size;
	}
	else if (ec)
	{
		m_error = ec;
		set_state(state_t::error_wait);
		test_socket_state();
		return false;
	}
	else
	{
		m_sm.inc_stats_counter(counters::utp_packets_out);
		++m_out_packets;
		++p->num_transmissions;
	}

	return !m_stalled;
}